

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O3

wchar_t read_header(archive_read *a,archive_entry *entry)

{
  byte bVar1;
  mtree *mtree;
  bool bVar2;
  __mode_t p;
  wchar_t wVar3;
  wchar_t wVar4;
  mode_t mVar5;
  int iVar6;
  mtree_entry *pmVar7;
  int *piVar8;
  archive_entry_linkresolver *res;
  void *__s;
  void *pvVar9;
  archive_string *paVar10;
  ushort **ppuVar11;
  size_t sVar12;
  mtree_entry **ppmVar13;
  archive_rb_node *paVar14;
  archive_rb_node *paVar15;
  size_t len;
  mtree_entry *pmVar16;
  ulong uVar17;
  la_int64_t lVar18;
  char *pcVar19;
  mtree_entry *pmVar20;
  char *pcVar21;
  size_t sVar22;
  __dev_t _Var23;
  ulong uVar24;
  archive_entry *rbt;
  char *pcVar25;
  mtree_option **global_00;
  char cVar26;
  uint uVar27;
  byte *pbVar28;
  long lVar29;
  undefined1 *puVar30;
  mtree_entry *pmVar31;
  mtree_entry *pmVar32;
  mtree_option *global;
  archive_entry *sparse_entry;
  stat_conflict1 st_storage;
  long local_120;
  archive_entry *local_118;
  wchar_t local_10c;
  mtree_entry *local_108;
  mtree_entry *local_100;
  mtree_entry *local_f8;
  archive_entry *local_f0;
  ulong local_e8;
  mtree_entry *local_e0;
  archive_rb_tree *local_d8;
  archive_entry *local_d0;
  mtree_entry **local_c8;
  stat local_c0;
  
  mtree = (mtree *)a->format->data;
  if (L'\xffffffff' < mtree->fd) {
    close(mtree->fd);
    mtree->fd = L'\xffffffff';
  }
  if (mtree->entries == (mtree_entry *)0x0) {
    res = archive_entry_linkresolver_new();
    mtree->resolver = res;
    if (res == (archive_entry_linkresolver *)0x0) {
      uVar24 = 0xffffffe2;
      goto LAB_0055e8ae;
    }
    local_f0 = entry;
    archive_entry_linkresolver_set_strategy(res,0x80000);
    mtree->archive_format = L'\x00080000';
    mtree->archive_format_name = "mtree";
    local_118 = (archive_entry *)0x0;
    detect_form(a,(wchar_t *)&local_d0);
    local_120 = 1;
    __s = __archive_read_ahead(a,1,(ssize_t *)&local_c0);
    if (__s != (void *)0x0) {
      local_c8 = &mtree->entries;
      local_d8 = &mtree->rbtree;
      local_f8 = (mtree_entry *)0x0;
LAB_0055e0af:
      lVar29 = 0;
      uVar17 = 0;
      do {
        _Var23 = local_c0.st_dev;
        if ((long)local_c0.st_dev < 0) goto LAB_0055e89b;
        pvVar9 = memchr(__s,10,local_c0.st_dev);
        if (pvVar9 != (void *)0x0) {
          _Var23 = (long)pvVar9 + (1 - (long)__s);
          local_c0.st_dev = _Var23;
        }
        if (0xffff < (long)(_Var23 + uVar17)) {
          pcVar19 = "Line too long";
          iVar6 = 0x54;
          goto LAB_0055e894;
        }
        paVar10 = archive_string_ensure((archive_string *)mtree,_Var23 + uVar17 + 1);
        if (paVar10 == (archive_string *)0x0) {
          pcVar19 = "Can\'t allocate working buffer";
          iVar6 = 0xc;
          goto LAB_0055e894;
        }
        memcpy((mtree->line).s + uVar17,__s,local_c0.st_dev);
        __archive_read_consume(a,local_c0.st_dev);
        uVar24 = local_c0.st_dev + uVar17;
        (mtree->line).s[uVar24] = '\0';
        pmVar7 = (mtree_entry *)(mtree->line).s;
        pbVar28 = (byte *)((long)(pmVar7->rbnode).rb_nodes + lVar29);
LAB_0055e148:
        bVar1 = *pbVar28;
        if (bVar1 < 0x5c) {
          if (bVar1 == 0x23) {
            if (pvVar9 == (void *)0x0) goto LAB_0055e186;
          }
          else {
            if (bVar1 == 0) goto LAB_0055e186;
            if (bVar1 == 10) {
              if (uVar24 == 0) break;
              if (-1 < (long)uVar24) {
                lVar29 = 0;
                pmVar31 = pmVar7;
                goto LAB_0055e1df;
              }
              free_options((mtree_option *)local_118);
              entry = local_f0;
              if ((int)uVar24 != 0) goto LAB_0055e8ae;
              goto LAB_0055dc50;
            }
          }
LAB_0055e17e:
          pbVar28 = pbVar28 + 1;
          goto LAB_0055e148;
        }
        if ((bVar1 != 0x5c) || (pbVar28[1] == 0)) goto LAB_0055e17e;
        if (pbVar28[1] != 10) {
          pbVar28 = pbVar28 + 1;
          goto LAB_0055e17e;
        }
        *(char *)((long)(pmVar7->rbnode).rb_nodes + (uVar24 - 2)) = '\0';
        uVar24 = uVar24 - 2;
        pmVar7 = (mtree_entry *)(mtree->line).s;
LAB_0055e186:
        lVar29 = (long)pbVar28 - (long)pmVar7;
        __s = __archive_read_ahead(a,1,(ssize_t *)&local_c0);
        uVar17 = uVar24;
      } while (__s != (void *)0x0);
    }
LAB_0055e6d7:
    mtree->this_entry = mtree->entries;
    free_options((mtree_option *)local_118);
    entry = local_f0;
  }
LAB_0055dc50:
  (a->archive).archive_format = mtree->archive_format;
  (a->archive).archive_format_name = mtree->archive_format_name;
  pmVar7 = mtree->this_entry;
  uVar24 = 1;
  if (pmVar7 != (mtree_entry *)0x0) {
    paVar10 = &mtree->current_dir;
    rbt = (archive_entry *)&mtree->rbtree;
    local_f0 = rbt;
    do {
      pcVar19 = pmVar7->name;
      if (((*pcVar19 == '.') && (pcVar19[1] == '.')) && (pcVar19[2] == '\0')) {
        pmVar7->used = '\x01';
        sVar22 = (mtree->current_dir).length;
        if (sVar22 != 0) {
          pcVar19 = paVar10->s;
          pcVar21 = pcVar19 + sVar22;
          do {
            pcVar25 = pcVar21;
            pcVar21 = pcVar25 + -1;
            if (pcVar21 < pcVar19) break;
          } while (*pcVar21 != '/');
          pcVar25 = pcVar25 + -2;
          if (pcVar21 < pcVar19) {
            pcVar25 = pcVar21;
          }
          (mtree->current_dir).length = (size_t)(pcVar25 + (1 - (long)pcVar19));
        }
      }
      else if (pmVar7->used == '\0') {
        pmVar7->used = '\x01';
        local_118 = entry;
        archive_entry_set_filetype(entry,0x8000);
        archive_entry_set_size(entry,0);
        (mtree->contents_name).length = 0;
        local_10c = L'\0';
        wVar3 = parse_line(a,entry,mtree,pmVar7,&local_10c);
        if (pmVar7->full == '\0') {
          sVar22 = (mtree->current_dir).length;
          if (sVar22 != 0) {
            archive_strcat(paVar10,"/");
          }
          archive_strcat(paVar10,pmVar7->name);
          archive_entry_copy_pathname(entry,paVar10->s);
          mVar5 = archive_entry_filetype(entry);
          rbt = local_f0;
          if (mVar5 != 0x4000) {
            (mtree->current_dir).length = sVar22;
          }
        }
        else {
          archive_entry_copy_pathname(entry,pmVar7->name);
          for (pmVar7 = (mtree_entry *)
                        __archive_rb_tree_find_node((archive_rb_tree *)rbt,pmVar7->name);
              pmVar7 != (mtree_entry *)0x0; pmVar7 = pmVar7->next_dup) {
            if ((pmVar7->full != '\0') && (pmVar7->used == '\0')) {
              pmVar7->used = '\x01';
              wVar4 = parse_line(a,entry,mtree,pmVar7,&local_10c);
              if (wVar4 < wVar3) {
                wVar3 = wVar4;
              }
            }
          }
        }
        if (mtree->checkfs == '\0') {
LAB_0055e82a:
          lVar18 = archive_entry_size(entry);
          mtree->cur_size = lVar18;
          mtree->offset = 0;
        }
        else {
          mtree->fd = L'\xffffffff';
          if ((mtree->contents_name).length == 0) {
            pcVar19 = archive_entry_pathname(entry);
          }
          else {
            pcVar19 = (mtree->contents_name).s;
          }
          mVar5 = archive_entry_filetype(entry);
          if ((mVar5 == 0x8000) || (mVar5 = archive_entry_filetype(entry), mVar5 == 0x4000)) {
            wVar4 = open(pcVar19,0x80000);
            mtree->fd = wVar4;
            __archive_ensure_cloexec_flag(wVar4);
            wVar4 = mtree->fd;
            if (wVar4 == L'\xffffffff') {
              piVar8 = __errno_location();
              if ((*piVar8 != 2) || ((mtree->contents_name).length != 0)) {
                archive_set_error(&a->archive,*piVar8,"Can\'t open %s",pcVar19);
                wVar3 = L'\xffffffec';
              }
              goto LAB_0055de49;
            }
          }
          else {
LAB_0055de49:
            wVar4 = mtree->fd;
          }
          if (wVar4 < L'\0') {
            iVar6 = lstat(pcVar19,&local_c0);
            if (iVar6 != -1) goto LAB_0055dea2;
LAB_0055deda:
            if ((local_10c & 0x800U) == 0) goto LAB_0055e82a;
LAB_0055dff5:
            pmVar7 = mtree->this_entry;
            goto LAB_0055dffe;
          }
          iVar6 = fstat(wVar4,&local_c0);
          if (iVar6 == -1) {
            piVar8 = __errno_location();
            archive_set_error(&a->archive,*piVar8,"Could not fstat %s",pcVar19);
            close(mtree->fd);
            mtree->fd = L'\xffffffff';
            wVar3 = L'\xffffffec';
            goto LAB_0055deda;
          }
LAB_0055dea2:
          p = local_c0.st_mode;
          uVar27 = local_c0.st_mode & 0xf000;
          if (uVar27 == 0xa000) {
            mVar5 = archive_entry_filetype(entry);
            if (mVar5 != 0xa000) goto LAB_0055df44;
LAB_0055e6f7:
            wVar4 = local_10c;
            if (((local_10c & 0x1001U) != 1) &&
               ((mVar5 = archive_entry_filetype(entry), mVar5 == 0x2000 ||
                (mVar5 = archive_entry_filetype(entry), mVar5 == 0x6000)))) {
              archive_entry_set_rdev(entry,local_c0.st_rdev);
            }
            if ((wVar4 & 0xcU) == 0 || ((uint)wVar4 >> 0xc & 1) != 0) {
              archive_entry_set_gid(entry,(ulong)local_c0.st_gid);
            }
            if ((wVar4 & 0x600U) == 0 || ((uint)wVar4 >> 0xc & 1) != 0) {
              archive_entry_set_uid(entry,(ulong)local_c0.st_uid);
            }
            if ((wVar4 & 0x1010U) != 0x10) {
              archive_entry_set_mtime(entry,local_c0.st_mtim.tv_sec,local_c0.st_mtim.tv_nsec);
            }
            if ((wVar4 & 0x1020U) != 0x20) {
              archive_entry_set_nlink(entry,(uint)local_c0.st_nlink);
            }
            if ((wVar4 & 0x1040U) != 0x40) {
              archive_entry_set_perm(entry,p);
            }
            if ((wVar4 & 0x1080U) != 0x80) {
              archive_entry_set_size(entry,local_c0.st_size);
            }
            archive_entry_set_ino(entry,local_c0.st_ino);
            archive_entry_set_dev(entry,local_c0.st_dev);
            archive_entry_linkify(mtree->resolver,&local_118,&local_d0);
            entry = local_118;
            goto LAB_0055e82a;
          }
          if ((uVar27 == 0x8000) && (mVar5 = archive_entry_filetype(entry), mVar5 == 0x8000))
          goto LAB_0055e6f7;
LAB_0055df44:
          if (((~p & 0xc000) == 0) && (mVar5 = archive_entry_filetype(entry), mVar5 == 0xc000))
          goto LAB_0055e6f7;
          switch(uVar27 - 0x1000 >> 0xc) {
          case 0:
            mVar5 = archive_entry_filetype(entry);
            if (mVar5 == 0x1000) goto LAB_0055e6f7;
            break;
          case 1:
            mVar5 = archive_entry_filetype(entry);
            if (mVar5 == 0x2000) goto LAB_0055e6f7;
            break;
          case 3:
            mVar5 = archive_entry_filetype(entry);
            if (mVar5 == 0x4000) goto LAB_0055e6f7;
            break;
          case 5:
            mVar5 = archive_entry_filetype(entry);
            if (mVar5 == 0x6000) goto LAB_0055e6f7;
          }
          if (L'\xffffffff' < mtree->fd) {
            close(mtree->fd);
          }
          mtree->fd = L'\xffffffff';
          if ((local_10c & 0x800U) != 0) goto LAB_0055dff5;
          if (wVar3 == L'\0') {
            pcVar19 = archive_entry_pathname(entry);
            archive_set_error(&a->archive,-1,"mtree specification has different type for %s",pcVar19
                             );
            wVar3 = L'\xffffffec';
          }
        }
        uVar24 = (ulong)(uint)wVar3;
        goto LAB_0055e8ae;
      }
LAB_0055dffe:
      pmVar7 = pmVar7->next;
      mtree->this_entry = pmVar7;
    } while (pmVar7 != (mtree_entry *)0x0);
    uVar24 = 1;
  }
LAB_0055e8ae:
  return (wchar_t)uVar24;
LAB_0055e1df:
  pmVar31 = (mtree_entry *)((long)(pmVar31->rbnode).rb_nodes + 1);
  bVar1 = *(byte *)((long)(pmVar7->rbnode).rb_nodes + lVar29);
  uVar24 = (ulong)bVar1;
  if (0x23 < uVar24) goto LAB_0055e23a;
  if ((0x100000200U >> (uVar24 & 0x3f) & 1) == 0) {
    if ((0x800002401U >> (uVar24 & 0x3f) & 1) != 0) goto LAB_0055e20e;
    goto LAB_0055e23a;
  }
  lVar29 = lVar29 + 1;
  goto LAB_0055e1df;
LAB_0055e23a:
  pmVar16 = (mtree_entry *)((long)(pmVar7->rbnode).rb_nodes + lVar29);
  uVar24 = (local_c0.st_dev + uVar17) - lVar29;
  pmVar32 = (mtree_entry *)((long)pmVar16 + (uVar24 - 1));
  if (pmVar16 < pmVar32) {
    local_100 = pmVar16;
    local_e8 = uVar24;
    ppuVar11 = __ctype_b_loc();
    pmVar20 = local_100;
    do {
      if ((*(byte *)((long)*ppuVar11 + (ulong)*(byte *)(pmVar20->rbnode).rb_nodes * 2 + 1) & 0x40)
          == 0) goto LAB_0055e8c3;
      pmVar20 = (mtree_entry *)((long)(pmVar20->rbnode).rb_nodes + 1);
      uVar24 = local_e8;
      pmVar16 = local_100;
    } while (pmVar20 < pmVar32);
  }
  wVar3 = (wchar_t)local_d0;
  if (bVar1 != 0x2f) {
    local_100 = pmVar16;
    local_e8 = uVar24;
    local_e0 = (mtree_entry *)malloc(0x40);
    if (local_e0 != (mtree_entry *)0x0) {
      *(undefined8 *)((long)&local_e0->options + 2) = 0;
      *(undefined8 *)((long)&local_e0->name + 2) = 0;
      local_e0->next = (mtree_entry *)0x0;
      local_e0->options = (mtree_option *)0x0;
      ppmVar13 = &local_f8->next;
      if (local_f8 == (mtree_entry *)0x0) {
        ppmVar13 = local_c8;
      }
      *ppmVar13 = local_e0;
      local_108 = local_e0;
      if (wVar3 != L'\0') {
        uVar24 = local_e8;
        local_f8 = local_100;
        if (0 < (long)local_e8) {
LAB_0055e43c:
          uVar17 = (ulong)*(byte *)(pmVar32->rbnode).rb_nodes;
          if ((uVar17 < 0x21) && ((0x100002600U >> (uVar17 & 0x3f) & 1) != 0))
          goto code_r0x0055e454;
          uVar17 = 0;
          do {
            if (((ulong)(byte)pmVar31[-1].field_0x3f < 0x21) &&
               ((0x100002600U >> ((ulong)(byte)pmVar31[-1].field_0x3f & 0x3f) & 1) != 0)) {
              local_f8 = pmVar31;
            }
            uVar17 = uVar17 + 1;
            pmVar31 = (mtree_entry *)((long)(pmVar31->rbnode).rb_nodes + 1);
          } while (uVar24 != uVar17);
        }
        goto LAB_0055e46e;
      }
      pcVar19 = (char *)strcspn((char *)local_100," \t\r\n");
      pmVar7 = (mtree_entry *)(pcVar19 + (long)((long)(pmVar7->rbnode).rb_nodes + lVar29));
      local_f8 = (mtree_entry *)((long)(pmVar7->rbnode).rb_nodes + local_e8);
      goto LAB_0055e551;
    }
    goto LAB_0055e903;
  }
  if (4 < (long)uVar24) {
    iVar6 = strncmp((char *)pmVar16,"/set",4);
    if (iVar6 == 0) {
      cVar26 = *(char *)((long)(pmVar7->rbnode).rb_nodes + lVar29 + 4);
      if ((cVar26 == ' ') || (cVar26 == '\t')) {
        pcVar19 = (char *)((long)(pmVar7->rbnode).rb_nodes + lVar29 + 4);
        while (sVar12 = strspn(pcVar19," \t\r\n"), pcVar19[sVar12] != '\0') {
          pcVar25 = pcVar19 + sVar12;
          sVar12 = strcspn(pcVar25," \t\r\n");
          pcVar19 = pcVar25 + sVar12;
          pcVar21 = strchr(pcVar25,0x3d);
          sVar22 = (long)pcVar21 - (long)pcVar25;
          if (pcVar19 < pcVar21) {
            sVar22 = sVar12;
          }
          remove_option((mtree_option **)&local_118,pcVar25,sVar22);
          wVar3 = add_option(a,(mtree_option **)&local_118,pcVar25,sVar12);
          uVar24 = (ulong)(uint)wVar3;
          if (wVar3 != L'\0') goto LAB_0055e8a1;
        }
        goto LAB_0055e20e;
      }
      goto LAB_0055e8c3;
    }
    if (((uVar24 < 7) || (iVar6 = strncmp((char *)pmVar16,"/unset",6), iVar6 != 0)) ||
       ((cVar26 = *(char *)((long)(pmVar7->rbnode).rb_nodes + lVar29 + 6), cVar26 != ' ' &&
        (cVar26 != '\t')))) goto LAB_0055e8c3;
    pcVar21 = (char *)((long)(pmVar7->rbnode).rb_nodes + lVar29 + 6);
    pcVar19 = strchr(pcVar21,0x3d);
    if (pcVar19 == (char *)0x0) {
      sVar12 = strspn(pcVar21," \t\r\n");
      cVar26 = *(char *)((long)(pmVar7->rbnode).rb_nodes + lVar29 + 6 + sVar12);
      if (cVar26 != '\0') {
        pcVar19 = (char *)((long)(pmVar7->rbnode).rb_nodes + lVar29 + sVar12 + 6);
        do {
          sVar12 = strcspn(pcVar19," \t\r\n");
          sVar22 = sVar12;
          if (sVar12 == 3) {
            if (((cVar26 != 'a') || (pcVar19[1] != 'l')) || (pcVar19[2] != 'l')) {
              sVar22 = 3;
              goto LAB_0055e3a5;
            }
            free_options((mtree_option *)local_118);
            local_118 = (archive_entry *)0x0;
          }
          else {
LAB_0055e3a5:
            remove_option((mtree_option **)&local_118,pcVar19,sVar22);
          }
          pcVar19 = pcVar19 + sVar12;
          sVar12 = strspn(pcVar19," \t\r\n");
          cVar26 = pcVar19[sVar12];
          pcVar19 = pcVar19 + sVar12;
        } while (cVar26 != '\0');
      }
      goto LAB_0055e20e;
    }
    pcVar19 = "/unset shall not contain `=\'";
    iVar6 = -1;
    goto LAB_0055e894;
  }
LAB_0055e8c3:
  archive_set_error(&a->archive,0x54,"Can\'t parse line %ju",local_120);
LAB_0055e89b:
  uVar24 = 0xffffffe2;
LAB_0055e8a1:
  free_options((mtree_option *)local_118);
  goto LAB_0055e8ae;
code_r0x0055e454:
  pmVar32 = (mtree_entry *)&pmVar32[-1].field_0x3f;
  bVar2 = (long)uVar24 < 2;
  uVar24 = uVar24 - 1;
  if (bVar2) goto code_r0x0055e464;
  goto LAB_0055e43c;
code_r0x0055e464:
  uVar24 = 0;
LAB_0055e46e:
  pcVar19 = (char *)((long)pmVar7 + lVar29 + (uVar24 - (long)local_f8));
  pmVar7 = local_100;
  local_100 = local_f8;
LAB_0055e551:
  pmVar31 = local_108;
  pcVar21 = (char *)malloc((size_t)(pcVar19 + 1));
  pmVar31->name = pcVar21;
  if (pcVar21 != (char *)0x0) {
    memcpy(pcVar21,local_100,(size_t)pcVar19);
    pcVar21[(long)pcVar19] = '\0';
    parse_escapes(pcVar21,pmVar31);
    pmVar16 = local_e0;
    pmVar31->next_dup = (mtree_entry *)0x0;
    if ((pmVar31->full != '\0') &&
       (iVar6 = __archive_rb_tree_insert_node(local_d8,&pmVar31->rbnode), iVar6 == 0)) {
      paVar14 = __archive_rb_tree_find_node(local_d8,pmVar31->name);
      do {
        paVar15 = paVar14;
        paVar14 = paVar15[1].rb_nodes[0];
      } while (paVar14 != (archive_rb_node *)0x0);
      paVar15[1].rb_nodes[0] = &pmVar31->rbnode;
    }
    global_00 = &pmVar16->options;
    puVar30 = (undefined1 *)&local_118;
    while (puVar30 = *(undefined1 **)puVar30, puVar30 != (undefined1 *)0x0) {
      pcVar19 = *(char **)((long)puVar30 + 8);
      sVar12 = strlen(pcVar19);
      wVar3 = add_option(a,global_00,pcVar19,sVar12);
      if (wVar3 != L'\0') goto LAB_0055e8e1;
    }
    while ((sVar12 = strspn((char *)pmVar7," \t\r\n"),
           *(char *)((long)(pmVar7->rbnode).rb_nodes + sVar12) != '\0' &&
           (pmVar31 = (mtree_entry *)((long)(pmVar7->rbnode).rb_nodes + sVar12), pmVar31 < local_f8)
           )) {
      len = strcspn((char *)pmVar31," \t\r\n");
      pmVar7 = (mtree_entry *)((long)(pmVar31->rbnode).rb_nodes + len);
      pmVar16 = (mtree_entry *)strchr((char *)pmVar31,0x3d);
      sVar12 = (long)pmVar16 - (long)pmVar31;
      if (pmVar7 < pmVar16) {
        sVar12 = len;
      }
      if (pmVar16 == (mtree_entry *)0x0) {
        sVar12 = len;
      }
      remove_option(global_00,(char *)pmVar31,sVar12);
      wVar3 = add_option(a,global_00,(char *)pmVar31,len);
      if (wVar3 != L'\0') goto LAB_0055e8e1;
    }
    local_f8 = local_108;
LAB_0055e20e:
    local_120 = local_120 + 1;
    __s = __archive_read_ahead(a,1,(ssize_t *)&local_c0);
    if (__s == (void *)0x0) goto LAB_0055e6d7;
    goto LAB_0055e0af;
  }
LAB_0055e903:
  piVar8 = __errno_location();
  iVar6 = *piVar8;
  pcVar19 = "Can\'t allocate memory";
LAB_0055e894:
  archive_set_error(&a->archive,iVar6,pcVar19);
  goto LAB_0055e89b;
LAB_0055e8e1:
  uVar24 = (ulong)(uint)wVar3;
  goto LAB_0055e8a1;
}

Assistant:

static int
read_header(struct archive_read *a, struct archive_entry *entry)
{
	struct mtree *mtree;
	char *p;
	int r, use_next;

	mtree = (struct mtree *)(a->format->data);

	if (mtree->fd >= 0) {
		close(mtree->fd);
		mtree->fd = -1;
	}

	if (mtree->entries == NULL) {
		mtree->resolver = archive_entry_linkresolver_new();
		if (mtree->resolver == NULL)
			return ARCHIVE_FATAL;
		archive_entry_linkresolver_set_strategy(mtree->resolver,
		    ARCHIVE_FORMAT_MTREE);
		r = read_mtree(a, mtree);
		if (r != ARCHIVE_OK)
			return (r);
	}

	a->archive.archive_format = mtree->archive_format;
	a->archive.archive_format_name = mtree->archive_format_name;

	for (;;) {
		if (mtree->this_entry == NULL)
			return (ARCHIVE_EOF);
		if (strcmp(mtree->this_entry->name, "..") == 0) {
			mtree->this_entry->used = 1;
			if (archive_strlen(&mtree->current_dir) > 0) {
				/* Roll back current path. */
				p = mtree->current_dir.s
				    + mtree->current_dir.length - 1;
				while (p >= mtree->current_dir.s && *p != '/')
					--p;
				if (p >= mtree->current_dir.s)
					--p;
				mtree->current_dir.length
				    = p - mtree->current_dir.s + 1;
			}
		}
		if (!mtree->this_entry->used) {
			use_next = 0;
			r = parse_file(a, entry, mtree, mtree->this_entry,
				&use_next);
			if (use_next == 0)
				return (r);
		}
		mtree->this_entry = mtree->this_entry->next;
	}
}